

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  bool bVar6;
  Limit limit;
  uint32 uVar8;
  UnknownFieldSet *pUVar9;
  Message *pMVar10;
  int64 iVar11;
  int iVar7;
  ulong uVar12;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  uint64 uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  uint uVar16;
  Reflection *this_00;
  int value_1;
  int key;
  undefined8 unaff_RBP;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  pair<unsigned_long,_bool> pVar19;
  pair<unsigned_long,_bool> pVar20;
  pair<unsigned_long,_bool> pVar21;
  pair<unsigned_long,_bool> pVar22;
  uint64 value;
  string local_e8;
  Limit local_c4;
  Reflection *local_c0;
  FieldDescriptor *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  uVar14 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (field == (FieldDescriptor *)0x0) {
    bVar6 = false;
  }
  else {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e8,
                 &local_b8);
    }
    if ((tag & 7) ==
        *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)*(uint *)(field + 0x38) * 4)) {
      uVar14 = 0;
    }
    else if (*(int *)(field + 0x3c) == 3) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_e8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b8 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e8,
                   &local_b8);
      }
      if (((tag & 7) == 2) && (*(int *)(field + 0x38) - 0xdU < 0xfffffffc)) {
        uVar14 = 0;
        bVar6 = true;
        goto LAB_002a4907;
      }
    }
    bVar6 = false;
  }
LAB_002a4907:
  if ((char)uVar14 != '\0') {
    pUVar9 = Reflection::MutableUnknownFields(this_00,message);
    bVar6 = SkipField(input,tag,pUVar9);
    return bVar6;
  }
  if (bVar6) {
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar16 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
        goto LAB_002a513c;
      }
    }
    else {
      uVar16 = 0;
    }
    iVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar16);
    uVar16 = (uint)iVar11;
    bVar6 = -1 < iVar11;
LAB_002a513c:
    if (!bVar6) {
      return false;
    }
    limit = io::CodedInputStream::PushLimit(input,uVar16);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e8,
                 &local_b8);
    }
    switch(*(undefined4 *)(field + 0x38)) {
    case 1:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
          }
          else {
            local_e8._M_dataplus._M_p = *(pointer *)puVar4;
            input->buffer_ = puVar4 + 8;
            bVar6 = true;
          }
          if (bVar6 == false) {
            return false;
          }
          Reflection::AddDouble(this_00,message,field,(double)local_e8._M_dataplus._M_p);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 2:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
          }
          else {
            local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar6 = true;
          }
          if (bVar6 == false) {
            return false;
          }
          Reflection::AddFloat(this_00,message,field,local_e8._M_dataplus._M_p._0_4_);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 3:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar15 = (unsigned_long)(char)*puVar4, -1 < (long)uVar15)) {
          input->buffer_ = puVar4 + 1;
          pVar22._8_8_ = 1;
          pVar22.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar22.first;
        }
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,uVar15);
      }
      break;
    case 4:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar13 = (uint64)(char)*puVar4, -1 < (long)uVar13)) {
          input->buffer_ = puVar4 + 1;
          pVar20._8_8_ = 1;
          pVar20.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar13 = pVar20.first;
        }
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddUInt64(this_00,message,field,uVar13);
      }
      break;
    case 5:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar14 = (ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002a53ed;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002a53ed:
          uVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)uVar14;
        }
        if (!bVar6) {
          return false;
        }
        Reflection::AddInt32(this_00,message,field,(int32)uVar14);
      }
      break;
    case 6:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
            if (!bVar6) {
              return false;
            }
          }
          else {
            local_e8._M_dataplus._M_p = *(pointer *)puVar4;
            input->buffer_ = puVar4 + 8;
          }
          Reflection::AddUInt64(this_00,message,field,(uint64)local_e8._M_dataplus._M_p);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 7:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
            if (!bVar6) {
              return false;
            }
          }
          else {
            local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
          }
          Reflection::AddUInt32(this_00,message,field,(uint32)local_e8._M_dataplus._M_p._0_4_);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 8:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar19._8_8_ = 1;
          pVar19.first = (long)(char)uVar2;
        }
        else {
          pVar19 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddBool(this_00,message,field,pVar19.first != 0);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      return false;
    case 0xd:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar14 = (ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002a5282;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002a5282:
          uVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)uVar14;
        }
        if (!bVar6) {
          return false;
        }
        Reflection::AddUInt32(this_00,message,field,(uint32)uVar14);
      }
      break;
    case 0xe:
      local_c4 = limit;
      local_c0 = this_00;
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar12 = (ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002a569a;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002a569a:
          uVar12 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)uVar12;
        }
        uVar5 = uVar14;
        if (bVar6) {
          uVar5 = uVar12;
        }
        uVar14 = uVar5 & 0xffffffff;
        if (!bVar6) {
          return false;
        }
        iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
        key = (int)uVar5;
        if (*(int *)(*(long *)(CONCAT44(extraout_var,iVar7) + 0x10) + 0x3c) == 3) {
          Reflection::AddEnumValue(local_c0,message,field,key);
        }
        else {
          this = FieldDescriptor::enum_type(field);
          value_00 = EnumDescriptor::FindValueByNumber(this,key);
          if (value_00 == (EnumValueDescriptor *)0x0) {
            pUVar9 = Reflection::MutableUnknownFields(local_c0,message);
            UnknownFieldSet::AddVarint(pUVar9,tag >> 3,(long)key);
            limit = local_c4;
          }
          else {
            Reflection::AddEnum(local_c0,message,field,value_00);
            limit = local_c4;
          }
        }
        if (!bVar6) {
          return false;
        }
      }
      break;
    case 0xf:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
          }
          else {
            local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar6 = true;
          }
          if (bVar6 == false) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32)local_e8._M_dataplus._M_p._0_4_);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 0x10:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
          }
          else {
            local_e8._M_dataplus._M_p = *(pointer *)puVar4;
            input->buffer_ = puVar4 + 8;
            bVar6 = true;
          }
          if (bVar6 == false) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64)local_e8._M_dataplus._M_p);
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case 0x11:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar14 = (ulong)bVar1;
          uVar8 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002a51c2;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar8 = 0;
LAB_002a51c2:
          uVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          bVar6 = -1 < (long)uVar14;
        }
        if (!bVar6) {
          return false;
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar14 & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff);
      }
      break;
    case 0x12:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar14 = (ulong)(char)*puVar4, -1 < (long)uVar14)) {
          input->buffer_ = puVar4 + 1;
          pVar21._8_8_ = 1;
          pVar21.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar14 = pVar21.first;
        }
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar14 & 1) ^ uVar14 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e8,&local_b8)
    ;
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p = *(pointer *)puVar4;
      input->buffer_ = puVar4 + 8;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(this_00,message,field,(double)local_e8._M_dataplus._M_p);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_e8._M_dataplus._M_p);
    }
    break;
  case 2:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddFloat(this_00,message,field,local_e8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,local_e8._M_dataplus._M_p._0_4_);
    }
    break;
  case 3:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar14 = (ulong)(char)*puVar4, -1 < (long)uVar14)) {
      input->buffer_ = puVar4 + 1;
      uVar16 = 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar21.first;
      uVar16 = pVar21._8_4_;
    }
    if ((uVar16 & 1) == 0) {
      return false;
    }
    goto LAB_002a4fa8;
  case 4:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar13 = (uint64)(char)*puVar4, -1 < (long)uVar13)) {
      input->buffer_ = puVar4 + 1;
      uVar16 = 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar13 = pVar21.first;
      uVar16 = pVar21._8_4_;
    }
    if ((uVar16 & 1) == 0) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(this_00,message,field,uVar13);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,uVar13);
    }
    goto LAB_002a501b;
  case 5:
    bVar6 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e8);
    if (!bVar6) {
      return false;
    }
    uVar16 = (uint)local_e8._M_dataplus._M_p._0_4_;
    goto LAB_002a4b10;
  case 6:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p = *(pointer *)puVar4;
      input->buffer_ = puVar4 + 8;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(this_00,message,field,(uint64)local_e8._M_dataplus._M_p);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,(uint64)local_e8._M_dataplus._M_p);
    }
    break;
  case 7:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) goto LAB_002a4b5a;
LAB_002a4dab:
    Reflection::SetUInt32(this_00,message,field,(uint32)local_e8._M_dataplus._M_p._0_4_);
    break;
  case 8:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar15 = (unsigned_long)(char)*puVar4, -1 < (long)uVar15))
    {
      input->buffer_ = puVar4 + 1;
      uVar16 = 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar15 = pVar21.first;
      uVar16 = pVar21._8_4_;
    }
    if ((uVar16 & 1) == 0) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(this_00,message,field,uVar15 != 0);
    }
    else {
      Reflection::SetBool(this_00,message,field,uVar15 != 0);
    }
    goto LAB_002a501b;
  case 9:
    iVar7 = *(int *)(*(long *)(field + 0x28) + 0x3c);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    bVar6 = WireFormatLite::ReadBytes(input,&local_e8);
    if (bVar6) {
      if (iVar7 == 3) {
        bVar6 = WireFormatLite::VerifyUtf8String
                          (local_e8._M_dataplus._M_p,(int)local_e8._M_string_length,PARSE,
                           (char *)**(undefined8 **)(field + 8));
        if (!bVar6) goto LAB_002a4e8a;
      }
      if (*(int *)(field + 0x3c) == 3) {
        paVar18 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        Reflection::AddString(this_00,message,field,&local_50);
        _Var17._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar18 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        Reflection::SetString(this_00,message,field,&local_70);
        _Var17._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != paVar18) {
        operator_delete(_Var17._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        return true;
      }
      operator_delete(local_e8._M_dataplus._M_p);
      return true;
    }
LAB_002a4e8a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      return false;
    }
    operator_delete(local_e8._M_dataplus._M_p);
    return false;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar10 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar10 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar6 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar10);
    break;
  case 0xb:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar10 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar10 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar6 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar10);
    break;
  case 0xc:
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    bVar6 = WireFormatLite::ReadBytes(input,&local_e8);
    if (!bVar6) goto LAB_002a4e8a;
    if (*(int *)(field + 0x3c) == 3) {
      paVar18 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      Reflection::AddString(this_00,message,field,&local_90);
      _Var17._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar18 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      Reflection::SetString(this_00,message,field,&local_b0);
      _Var17._M_p = local_b0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != paVar18) {
      operator_delete(_Var17._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    break;
  case 0xd:
    bVar6 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e8);
    if (!bVar6) {
      return false;
    }
    if (*(int *)(field + 0x3c) != 3) goto LAB_002a4dab;
LAB_002a4b5a:
    Reflection::AddUInt32(this_00,message,field,(uint32)local_e8._M_dataplus._M_p._0_4_);
    break;
  case 0xe:
    bVar6 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e8);
    if (!bVar6) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddEnumValue(this_00,message,field,(int)local_e8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,(int)local_e8._M_dataplus._M_p._0_4_);
    }
    break;
  case 0xf:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    iVar7 = *(int *)(field + 0x3c);
    uVar16 = (uint)local_e8._M_dataplus._M_p._0_4_;
    goto joined_r0x002a4a60;
  case 0x10:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e8);
    }
    else {
      local_e8._M_dataplus._M_p = *(pointer *)puVar4;
      input->buffer_ = puVar4 + 8;
      bVar6 = true;
    }
    if (bVar6 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(this_00,message,field,(int64)local_e8._M_dataplus._M_p);
    }
    else {
      Reflection::SetInt64(this_00,message,field,(int64)local_e8._M_dataplus._M_p);
    }
    break;
  case 0x11:
    bVar6 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e8);
    if (!bVar6) {
      return false;
    }
    uVar16 = -((uint)local_e8._M_dataplus._M_p._0_4_ & 1) ^
             (uint)local_e8._M_dataplus._M_p._0_4_ >> 1;
LAB_002a4b10:
    iVar7 = *(int *)(field + 0x3c);
joined_r0x002a4a60:
    if (iVar7 == 3) {
      Reflection::AddInt32(this_00,message,field,uVar16);
    }
    else {
      Reflection::SetInt32(this_00,message,field,uVar16);
    }
    break;
  case 0x12:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar14 = (ulong)(char)*puVar4, -1 < (long)uVar14)) {
      input->buffer_ = puVar4 + 1;
      uVar16 = 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar21.first;
      uVar16 = pVar21._8_4_;
    }
    if ((uVar16 & 1) == 0) {
      return false;
    }
    uVar14 = -(ulong)((uint)uVar14 & 1) ^ uVar14 >> 1;
LAB_002a4fa8:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(this_00,message,field,uVar14);
    }
    else {
      Reflection::SetInt64(this_00,message,field,uVar14);
    }
LAB_002a501b:
    if ((uVar16 & 1) == 0) {
      return false;
    }
    return true;
  default:
    goto LAB_002a57b4;
  }
  if (bVar6 == false) {
    return false;
  }
LAB_002a57b4:
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,  // May be NULL for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32, Int32)
      HANDLE_PACKED_TYPE(INT64, int64, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32, Int32)
      HANDLE_TYPE(INT64, int64, Int64)
      HANDLE_TYPE(SINT32, int32, Int32)
      HANDLE_TYPE(SINT64, int64, Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}